

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O2

void Cut_OracleFreeCuts(Cut_Oracle_t *p,int Node)

{
  char *pcVar1;
  char *Entry;
  char *pcVar2;
  char *pEntry;
  
  Entry = (char *)Vec_PtrEntry(p->vCutsNew,Node);
  if (Entry != (char *)0x0) {
    pcVar1 = *(char **)(Entry + 0x10);
    pEntry = Entry;
    while (pcVar2 = pcVar1, pEntry != (char *)0x0) {
      Extra_MmFixedEntryRecycle(p->pMmCuts,pEntry);
      pcVar1 = (char *)0x0;
      pEntry = pcVar2;
      if (pcVar2 != (char *)0x0) {
        pcVar1 = *(char **)(pcVar2 + 0x10);
      }
    }
    Vec_PtrWriteEntry(p->vCutsNew,Node,Entry);
    return;
  }
  return;
}

Assistant:

void Cut_OracleFreeCuts( Cut_Oracle_t * p, int Node )
{
    Cut_Cut_t * pList, * pCut, * pCut2;
    pList = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node );
    if ( pList == NULL )
        return;
    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        Extra_MmFixedEntryRecycle( p->pMmCuts, (char *)pCut );
    Vec_PtrWriteEntry( p->vCutsNew, Node, pList );
}